

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibCore.cpp
# Opt level: O2

Variant * Jinx::Impl::AsyncCallWith
                    (Variant *__return_storage_ptr__,ScriptPtr *script,Parameters *params)

{
  pointer pVVar1;
  _Rb_tree_node_base *p_Var2;
  RuntimeID functionID;
  char *message;
  CollectionPtr collPtr;
  ScriptIPtr s;
  Parameters fnParams;
  undefined1 local_78 [16];
  __shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2> local_68;
  vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> local_58;
  shared_ptr<Jinx::IScript> local_38;
  
  std::static_pointer_cast<Jinx::Impl::Script,Jinx::IScript>((shared_ptr<Jinx::IScript> *)&local_68)
  ;
  pVVar1 = (params->super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pVVar1 == (params->super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>)._M_impl
                .super__Vector_impl_data._M_finish) {
    message = "\'async call with\' function invoked with no parameters";
  }
  else {
    if (pVVar1->m_type == Function) {
      local_58.super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_58.super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if (pVVar1[1].m_type == Collection) {
        Variant::GetCollection((Variant *)local_78);
        for (p_Var2 = (_Rb_tree_node_base *)
                      ((element_type *)(local_78._0_8_ + 0x18))->_vptr_ICoroutine;
            p_Var2 != (_Rb_tree_node_base *)(local_78._0_8_ + 8);
            p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
          std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::push_back
                    (&local_58,(value_type *)&p_Var2[2]._M_parent);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
      }
      else {
        std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::push_back(&local_58,pVVar1 + 1)
        ;
      }
      std::__shared_ptr<Jinx::IScript,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<Jinx::Impl::Script,void>
                ((__shared_ptr<Jinx::IScript,(__gnu_cxx::_Lock_policy)2> *)&local_38,&local_68);
      functionID = Variant::GetFunction
                             ((params->
                              super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>).
                              _M_impl.super__Vector_impl_data._M_start);
      CreateCoroutine((Jinx *)local_78,&local_38,functionID,&local_58);
      Variant::Variant(__return_storage_ptr__,(CoroutinePtr *)local_78);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_38.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::~vector(&local_58);
      goto LAB_001186cb;
    }
    message = "Invalid parameters to \'async call with\' function";
  }
  Script::Error(local_68._M_ptr,message);
  __return_storage_ptr__->m_type = Null;
  Variant::SetNull(__return_storage_ptr__);
LAB_001186cb:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant AsyncCallWith(ScriptPtr script, const Parameters & params)
	{
		ScriptIPtr s = std::static_pointer_cast<Script>(script);
		if (params.empty())
		{
			s->Error("'async call with' function invoked with no parameters");
			return nullptr;
		}
		if (!params[0].IsFunction())
		{
			s->Error("Invalid parameters to 'async call with' function");
			return nullptr;
		}
		Parameters fnParams;
		if (params[1].IsCollection())
		{
			auto collPtr = params[1].GetCollection();
			auto & coll = *collPtr;
			for (const auto & pair : coll)
				fnParams.push_back(pair.second);
		}
		else
		{
			fnParams.push_back(params[1]);
		}
		return CreateCoroutine(s, params[0].GetFunction(), fnParams);
	}